

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

DirHandle * createDirHandle(PHYSFS_Io *io,char *newDir,char *mountPoint,int forWriting)

{
  _func_void_PHYSFS_Io_ptr *p_Var1;
  _func_void_void_ptr *p_Var2;
  char *pcVar3;
  _func_void_ptr_PHYSFS_uint64 *p_Var4;
  int iVar5;
  size_t sVar6;
  ulong *puVar7;
  void *pvVar8;
  char *pcVar9;
  DirHandle *pDVar10;
  ErrState *pEVar11;
  char *pcVar12;
  PHYSFS_ErrorCode errcode;
  ulong *puVar13;
  PHYSFS_Archiver *pPVar14;
  PHYSFS_Archiver **ppPVar15;
  bool bVar16;
  ulong uStack_88;
  undefined1 local_80 [8];
  PHYSFS_Stat statbuf;
  int local_34 [2];
  int claimed;
  
  puVar13 = &uStack_88;
  if (mountPoint == (char *)0x0) {
    mountPoint = (char *)0x0;
    puVar7 = (ulong *)0x0;
LAB_00107859:
    bVar16 = false;
    local_34[0] = 0;
    if (io == (PHYSFS_Io *)0x0) {
      puVar13[-1] = 0x10787f;
      iVar5 = __PHYSFS_platformStat(newDir,(PHYSFS_Stat *)local_80,1);
      if (iVar5 == 0) {
        pDVar10 = (DirHandle *)0x0;
LAB_001078f0:
        io = (PHYSFS_Io *)0x0;
        bVar16 = false;
      }
      else if ((int)statbuf.accesstime == 1) {
        io = (PHYSFS_Io *)0x0;
        puVar13[-1] = 0x1078a3;
        pvVar8 = DIR_openArchive((PHYSFS_Io *)0x0,newDir,forWriting,local_34);
        pDVar10 = (DirHandle *)0x0;
        if (pvVar8 != (void *)0x0) {
          puVar13[-1] = 0x1078bc;
          pDVar10 = (DirHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(0x38);
          if (pDVar10 == (DirHandle *)0x0) {
            puVar13[-1] = 0x107905;
            DIR_closeArchive(pvVar8);
            pDVar10 = (DirHandle *)0x0;
          }
          else {
            pDVar10->rootlen = 0;
            pDVar10->funcs = (PHYSFS_Archiver *)0x0;
            pDVar10->opaque = (void *)0x0;
            pDVar10->dirName = (char *)0x0;
            pDVar10->mountPoint = (char *)0x0;
            pDVar10->root = (char *)0x0;
            pDVar10->next = (__PHYSFS_DIRHANDLE__ *)0x0;
            pDVar10->funcs = &__PHYSFS_Archiver_DIR;
            pDVar10->opaque = pvVar8;
          }
        }
        if (pDVar10 != (DirHandle *)0x0) goto LAB_001078f0;
        bVar16 = false;
        if (local_34[0] == 0) goto LAB_00107921;
      }
      else {
LAB_00107921:
        puVar13[-1] = 0x107939;
        io = __PHYSFS_createNativeIo(newDir,(uint)(forWriting != 0) * 5 + 0x72);
        bVar16 = io != (PHYSFS_Io *)0x0;
        pDVar10 = (DirHandle *)0x0;
      }
      if (bVar16) goto LAB_00107953;
    }
    else {
      pDVar10 = (DirHandle *)0x0;
LAB_00107953:
      puVar13[-1] = 0x107965;
      pcVar9 = strchr(newDir,0x2e);
      statbuf._32_8_ = puVar7;
      pcVar12 = pcVar9;
      ppPVar15 = archivers;
      while (pcVar3 = pcVar9, archivers = ppPVar15, pcVar3 != (char *)0x0) {
        puVar13[-1] = 0x107981;
        pcVar9 = strchr(pcVar3 + 1,0x2e);
        pcVar12 = pcVar3;
        ppPVar15 = archivers;
      }
      pPVar14 = *ppPVar15;
      if (pcVar12 == (char *)0x0) {
        if ((local_34[0] == 0 && pDVar10 == (DirHandle *)0x0) && pPVar14 != (PHYSFS_Archiver *)0x0)
        {
          do {
            ppPVar15 = ppPVar15 + 1;
            puVar13[-1] = 0x107aa7;
            pDVar10 = tryOpenDir(io,pPVar14,newDir,forWriting,local_34);
            pPVar14 = *ppPVar15;
            if ((pPVar14 == (PHYSFS_Archiver *)0x0) || (pDVar10 != (DirHandle *)0x0)) break;
          } while (local_34[0] == 0);
        }
      }
      else {
        if ((local_34[0] == 0 && pDVar10 == (DirHandle *)0x0) && pPVar14 != (PHYSFS_Archiver *)0x0)
        {
          do {
            puVar13[-1] = 0x1079d9;
            iVar5 = PHYSFS_utf8stricmp((char *)*puVar13,(char *)puVar13[-1]);
            if (iVar5 == 0) {
              pPVar14 = *ppPVar15;
              puVar13[-1] = 0x1079f8;
              pDVar10 = tryOpenDir(io,pPVar14,newDir,forWriting,local_34);
            }
            else {
              pDVar10 = (DirHandle *)0x0;
            }
          } while (((ppPVar15[1] != (PHYSFS_Archiver *)0x0) && (pDVar10 == (DirHandle *)0x0)) &&
                  (ppPVar15 = ppPVar15 + 1, local_34[0] == 0));
        }
        if (((*archivers != (PHYSFS_Archiver *)0x0) && (pDVar10 == (DirHandle *)0x0)) &&
           (local_34[0] == 0)) {
          ppPVar15 = archivers;
          do {
            puVar13[-1] = 0x107a4d;
            iVar5 = PHYSFS_utf8stricmp((char *)*puVar13,(char *)puVar13[-1]);
            if (iVar5 == 0) {
              pDVar10 = (DirHandle *)0x0;
            }
            else {
              pPVar14 = *ppPVar15;
              puVar13[-1] = 0x107a67;
              pDVar10 = tryOpenDir(io,pPVar14,newDir,forWriting,local_34);
            }
          } while (((ppPVar15[1] != (PHYSFS_Archiver *)0x0) && (pDVar10 == (DirHandle *)0x0)) &&
                  (ppPVar15 = ppPVar15 + 1, local_34[0] == 0));
        }
      }
      puVar13[-1] = 0x107ac6;
      pEVar11 = findErrorForCurrentThread();
      puVar7 = (ulong *)statbuf._32_8_;
      if (pEVar11 == (ErrState *)0x0) {
        errcode = PHYSFS_ERR_OK;
      }
      else {
        errcode = pEVar11->code;
      }
      if ((bVar16) && (pDVar10 == (DirHandle *)0x0)) {
        p_Var1 = io->destroy;
        puVar13[-1] = 0x107aed;
        (*p_Var1)(io);
      }
      if (pDVar10 == (DirHandle *)0x0) {
        if (errcode != PHYSFS_ERR_OK || local_34[0] == 0) {
          if (local_34[0] == 0) {
            errcode = PHYSFS_ERR_UNSUPPORTED;
          }
          puVar13[-1] = 0x107b17;
          PHYSFS_setErrorCode(errcode);
        }
        pDVar10 = (DirHandle *)0x0;
      }
    }
    p_Var4 = __PHYSFS_AllocatorHooks.Malloc;
    if (pDVar10 == (DirHandle *)0x0) goto LAB_00107b99;
    puVar13[-1] = 0x107b32;
    sVar6 = strlen(newDir);
    puVar13[-1] = 0x107b38;
    pcVar12 = (char *)(*p_Var4)(sVar6 + 1);
    pDVar10->dirName = pcVar12;
    if (pcVar12 != (char *)0x0) {
      puVar13[-1] = 0x107b4c;
      strcpy(pcVar12,newDir);
      p_Var4 = __PHYSFS_AllocatorHooks.Malloc;
      if (((ulong *)mountPoint == (ulong *)0x0) || ((char)*(ulong *)mountPoint == '\0'))
      goto LAB_00107bd7;
      puVar13[-1] = 0x107b6b;
      sVar6 = strlen(mountPoint);
      puVar13[-1] = 0x107b71;
      pcVar12 = (char *)(*p_Var4)(sVar6 + 2);
      pDVar10->mountPoint = pcVar12;
      if (pcVar12 != (char *)0x0) {
        puVar13[-1] = 0x107b85;
        strcpy(pcVar12,mountPoint);
        pcVar12 = pDVar10->mountPoint;
        puVar13[-1] = 0x107b91;
        sVar6 = strlen(pcVar12);
        pcVar12 = pcVar12 + sVar6;
        pcVar12[0] = '/';
        pcVar12[1] = '\0';
        goto LAB_00107bd7;
      }
    }
    puVar13[-1] = 0x107ba8;
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
  }
  else {
    sVar6 = strlen(mountPoint);
    if (sVar6 + 1 < 0x100) {
      puVar7 = (ulong *)((long)&uStack_88 - (sVar6 + 0x18 & 0xfffffffffffffff0));
      puVar13 = puVar7;
    }
    else {
      puVar7 = (ulong *)0x0;
      puVar13 = &uStack_88;
    }
    bVar16 = puVar7 == (ulong *)0x0;
    if (bVar16) {
      puVar13[-1] = 0x107813;
      puVar7 = (ulong *)(*__PHYSFS_AllocatorHooks.Malloc)(sVar6 + 9);
    }
    if (puVar7 == (ulong *)0x0) {
      puVar7 = (ulong *)0x0;
    }
    else {
      *puVar7 = (ulong)bVar16;
      puVar7 = puVar7 + 1;
    }
    if (puVar7 == (ulong *)0x0) {
      puVar13[-1] = 0x10784f;
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      bVar16 = false;
    }
    else {
      puVar13[-1] = 0x10783a;
      iVar5 = sanitizePlatformIndependentPath(mountPoint,(char *)puVar7);
      bVar16 = iVar5 != 0;
      if (bVar16) {
        mountPoint = (char *)puVar7;
      }
    }
    if (bVar16) goto LAB_00107859;
LAB_00107b99:
    pDVar10 = (DirHandle *)0x0;
  }
  if (pDVar10 != (DirHandle *)0x0) {
    pvVar8 = pDVar10->opaque;
    p_Var2 = pDVar10->funcs->closeArchive;
    *(undefined8 *)((long)puVar13 + -8) = 0x107bb7;
    (*p_Var2)(pvVar8);
    pcVar12 = pDVar10->dirName;
    *(undefined8 *)((long)puVar13 + -8) = 0x107bc1;
    (*__PHYSFS_AllocatorHooks.Free)(pcVar12);
    pcVar12 = pDVar10->mountPoint;
    *(undefined8 *)((long)puVar13 + -8) = 0x107bcb;
    (*__PHYSFS_AllocatorHooks.Free)(pcVar12);
    *(undefined8 *)((long)puVar13 + -8) = 0x107bd4;
    (*__PHYSFS_AllocatorHooks.Free)(pDVar10);
  }
  pDVar10 = (DirHandle *)0x0;
LAB_00107bd7:
  if ((puVar7 != (ulong *)0x0) && (puVar7[-1] != 0)) {
    *(undefined8 *)((long)puVar13 + -8) = 0x107bf0;
    (*__PHYSFS_AllocatorHooks.Free)(puVar7 + -1);
  }
  return pDVar10;
}

Assistant:

static DirHandle *createDirHandle(PHYSFS_Io *io, const char *newDir,
                                  const char *mountPoint, int forWriting)
{
    DirHandle *dirHandle = NULL;
    char *tmpmntpnt = NULL;

    assert(newDir != NULL);  /* should have caught this higher up. */

    if (mountPoint != NULL)
    {
        const size_t len = strlen(mountPoint) + 1;
        tmpmntpnt = (char *) __PHYSFS_smallAlloc(len);
        GOTO_IF(!tmpmntpnt, PHYSFS_ERR_OUT_OF_MEMORY, badDirHandle);
        if (!sanitizePlatformIndependentPath(mountPoint, tmpmntpnt))
            goto badDirHandle;
        mountPoint = tmpmntpnt;  /* sanitized version. */
    } /* if */

    dirHandle = openDirectory(io, newDir, forWriting);
    GOTO_IF_ERRPASS(!dirHandle, badDirHandle);

    dirHandle->dirName = (char *) allocator.Malloc(strlen(newDir) + 1);
    GOTO_IF(!dirHandle->dirName, PHYSFS_ERR_OUT_OF_MEMORY, badDirHandle);
    strcpy(dirHandle->dirName, newDir);

    if ((mountPoint != NULL) && (*mountPoint != '\0'))
    {
        dirHandle->mountPoint = (char *)allocator.Malloc(strlen(mountPoint)+2);
        if (!dirHandle->mountPoint)
            GOTO(PHYSFS_ERR_OUT_OF_MEMORY, badDirHandle);
        strcpy(dirHandle->mountPoint, mountPoint);
        strcat(dirHandle->mountPoint, "/");
    } /* if */

    __PHYSFS_smallFree(tmpmntpnt);
    return dirHandle;

badDirHandle:
    if (dirHandle != NULL)
    {
        dirHandle->funcs->closeArchive(dirHandle->opaque);
        allocator.Free(dirHandle->dirName);
        allocator.Free(dirHandle->mountPoint);
        allocator.Free(dirHandle);
    } /* if */

    __PHYSFS_smallFree(tmpmntpnt);
    return NULL;
}